

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadioButton.cpp
# Opt level: O0

void __thiscall gui::RadioButton::computeResize(RadioButton *this)

{
  float fVar1;
  float fVar2;
  uint uVar3;
  element_type *peVar4;
  Button *in_RDI;
  float X;
  FloatRect bounds;
  Text *this_00;
  Button *this_01;
  Vector2f local_20;
  FloatRect local_18;
  
  this_01 = in_RDI + 1;
  peVar4 = std::__shared_ptr_access<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d5054);
  this_00 = &(peVar4->super_CheckBoxStyle).text_;
  Button::getLabel(in_RDI);
  sf::Text::setString((Text *)this_01,(String *)this_00);
  std::__shared_ptr_access<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x1d507e);
  local_18 = sf::Text::getLocalBounds(this_00);
  peVar4 = std::__shared_ptr_access<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d50a3);
  fVar1 = (peVar4->super_CheckBoxStyle).textPadding_.x;
  X = fVar1 + fVar1 + local_18.left + local_18.width;
  peVar4 = std::__shared_ptr_access<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d50d3);
  fVar1 = (peVar4->super_CheckBoxStyle).textPadding_.y;
  peVar4 = std::__shared_ptr_access<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1d50eb);
  fVar2 = (peVar4->super_CheckBoxStyle).textPadding_.z;
  std::__shared_ptr_access<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<gui::RadioButtonStyle,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x1d5103);
  uVar3 = CheckBoxStyle::getCharacterSize((CheckBoxStyle *)0x1d510b);
  sf::Vector2<float>::Vector2(&local_20,X,fVar1 + fVar1 + fVar2 * (float)uVar3);
  in_RDI->size_ = local_20;
  (in_RDI->size_).x = (in_RDI->size_).y + (in_RDI->size_).x;
  return;
}

Assistant:

void RadioButton::computeResize() const {
    style_->text_.setString(getLabel());
    const auto bounds = style_->text_.getLocalBounds();
    size_ = sf::Vector2f(
        2.0f * style_->textPadding_.x + bounds.left + bounds.width,
        2.0f * style_->textPadding_.y + style_->textPadding_.z * style_->getCharacterSize()
    );
    size_.x += size_.y;
}